

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_decompress.c
# Opt level: O0

int decode_new_symbol(byte_t *input_buffer)

{
  bool bVar1;
  adh_node_t *node_00;
  adh_node_t *node;
  int num_bytes;
  byte_t new_symbol [1];
  byte_t *input_buffer_local;
  
  _num_bytes = input_buffer;
  memset((void *)((long)&node + 7),0,1);
  node._0_4_ = read_data_cross_bytes(_num_bytes,8,(byte_t *)((long)&node + 7));
  bVar1 = (int)(uint)node < 2;
  if (bVar1) {
    output_symbol(node._7_1_);
    node_00 = adh_create_node_and_append((ushort)node._7_1_);
    adh_update_tree(node_00,true);
  }
  else {
    log_error("decode_new_symbol","expected 1 byte received %d bytes",(ulong)(uint)node);
  }
  input_buffer_local._4_4_ = (uint)!bVar1;
  return input_buffer_local._4_4_;
}

Assistant:

int decode_new_symbol(const byte_t input_buffer[]) {
#ifdef _DEBUG
    log_debug("decode_new_symbol", "in_bit_idx=%-8u\n", in_bit_idx);
#endif

    byte_t  new_symbol[1] = {0};
    int     num_bytes = read_data_cross_bytes(input_buffer, SYMBOL_BITS, new_symbol);
    if(num_bytes > 1) {
        log_error("decode_new_symbol", "expected 1 byte received %d bytes", num_bytes);
        return RC_FAIL;
    }

    output_symbol(new_symbol[0]);
    adh_node_t * node = adh_create_node_and_append(new_symbol[0]);
    adh_update_tree(node, true);
    return RC_OK;
}